

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O1

void __thiscall serial::IOException::IOException(IOException *this,string *file,int line,int errnum)

{
  pointer pcVar1;
  char *__s;
  ostream *poVar2;
  size_t sVar3;
  stringstream ss;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->super_SerialException).e_what_._M_dataplus._M_p =
       (pointer)&(this->super_SerialException).e_what_.field_2;
  (this->super_SerialException).e_what_._M_string_length = 0;
  (this->super_SerialException).e_what_.field_2._M_local_buf[0] = '\0';
  *(undefined ***)&this->super_SerialException = &PTR__IOException_00112d50;
  (this->file_)._M_dataplus._M_p = (pointer)&(this->file_).field_2;
  pcVar1 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file_,pcVar1,pcVar1 + file->_M_string_length);
  this->line_ = line;
  (this->e_what_)._M_dataplus._M_p = (pointer)&(this->e_what_).field_2;
  (this->e_what_)._M_string_length = 0;
  (this->e_what_).field_2._M_local_buf[0] = '\0';
  this->errno_ = errnum;
  std::__cxx11::stringstream::stringstream(local_1b8);
  __s = strerror(errnum);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"IO Exception (",0xe);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->errno_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"): ",3);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", file ",7);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->file_)._M_dataplus._M_p,(this->file_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", line ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->line_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

explicit IOException (std::string file, int line, int errnum)
    : file_(file), line_(line), errno_(errnum) {
      std::stringstream ss;
#if defined(_WIN32) && !defined(__MINGW32__)
      char error_str [1024];
      strerror_s(error_str, 1024, errnum);
#else
      char * error_str = strerror(errnum);
#endif
      ss << "IO Exception (" << errno_ << "): " << error_str;
      ss << ", file " << file_ << ", line " << line_ << ".";
      e_what_ = ss.str();
  }